

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O3

int readerTest(char *filename,size_t limit,int options,int fail)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000014;
  int iVar3;
  char *pcVar4;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  lVar2 = xmlReaderForFile(filename,0,CONCAT44(in_register_00000014,options));
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to open \'%s\' test\n",filename);
    return 1;
  }
  do {
    iVar1 = xmlTextReaderRead(lVar2);
  } while (iVar1 == 1);
  if (iVar1 == 0) {
    if (fail == 0) {
LAB_001033d6:
      iVar1 = 0;
      goto LAB_001033d8;
    }
    iVar1 = strncmp(filename,"crazy:",6);
    if (iVar1 == 0) {
      pcVar4 = "Failed to get failure for \'%s\' %u\n";
      goto LAB_0010344d;
    }
    pcVar4 = "Failed to get failure for \'%s\' %lu\n";
LAB_00103469:
    fprintf(_stderr,pcVar4,filename,limit);
  }
  else {
    if (fail != 0) goto LAB_001033d6;
    iVar1 = strncmp(filename,"crazy:",6);
    if (iVar1 != 0) {
      pcVar4 = "Failed to parse \'%s\' %lu\n";
      goto LAB_00103469;
    }
    pcVar4 = "Failed to parse \'%s\' %u\n";
LAB_0010344d:
    fprintf(_stderr,pcVar4,filename,(ulong)crazy_indx);
  }
  iVar1 = 1;
LAB_001033d8:
  iVar3 = 1;
  if (timeout == 0) {
    iVar3 = iVar1;
  }
  xmlFreeTextReader(lVar2);
  return iVar3;
}

Assistant:

static int
readerTest(const char *filename, size_t limit, int options, int fail) {
    xmlTextReaderPtr reader;
    int res = 0;
    int ret;

    nb_tests++;

    maxlen = limit;
    reader = xmlReaderForFile(filename , NULL, options);
    if (reader == NULL) {
        fprintf(stderr, "Failed to open '%s' test\n", filename);
	return(1);
    }
    ret = xmlTextReaderRead(reader);
    while (ret == 1) {
        ret = xmlTextReaderRead(reader);
    }
    if (ret != 0) {
        if (fail)
            res = 0;
        else {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to parse '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to parse '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            if (strncmp(filename, "crazy:", 6) == 0)
                fprintf(stderr, "Failed to get failure for '%s' %u\n",
                        filename, crazy_indx);
            else
                fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                        filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    if (timeout)
        res = 1;
    xmlFreeTextReader(reader);

    return(res);
}